

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

Abc_Obj_t * Abc_ObjFaninReal(Abc_Obj_t *pObj,int i)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *local_28;
  Abc_Obj_t *pRes;
  int i_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsBox(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsPo(pObj);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsPo(pObj) || Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                      ,0x38,"Abc_Obj_t *Abc_ObjFaninReal(Abc_Obj_t *, int)");
      }
    }
    pAVar2 = Abc_ObjFanin(pObj,i);
    local_28 = Abc_ObjFanin0(pAVar2);
  }
  else {
    pAVar2 = Abc_ObjFanin(pObj,i);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    local_28 = Abc_ObjFanin0(pAVar2);
  }
  iVar1 = Abc_ObjIsBo(local_28);
  if (iVar1 == 0) {
    pObj_local = local_28;
  }
  else {
    pObj_local = Abc_ObjFanin0(local_28);
  }
  return pObj_local;
}

Assistant:

static inline Abc_Obj_t * Abc_ObjFaninReal( Abc_Obj_t * pObj, int i )    
{
    Abc_Obj_t * pRes;
    if ( Abc_ObjIsBox(pObj) )
        pRes = Abc_ObjFanin0( Abc_ObjFanin0( Abc_ObjFanin(pObj, i) ) );
    else
    {
        assert( Abc_ObjIsPo(pObj) || Abc_ObjIsNode(pObj) );
        pRes = Abc_ObjFanin0( Abc_ObjFanin(pObj, i) );
    }
    if ( Abc_ObjIsBo(pRes) )
        return Abc_ObjFanin0(pRes);
    return pRes;
}